

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int clearDatabasePage(BtShared *pBt,Pgno pgno,int freePageFlag,int *pnChange)

{
  u8 uVar1;
  u8 uVar2;
  ushort uVar3;
  u8 *puVar4;
  BtShared *pBt_00;
  Pgno PVar5;
  int iVar6;
  u32 uVar7;
  undefined1 local_60 [8];
  CellInfo info;
  int hdr;
  int i;
  uchar *pCell;
  MemPage *pMStack_30;
  int rc;
  MemPage *pPage;
  int *pnChange_local;
  int freePageFlag_local;
  Pgno pgno_local;
  BtShared *pBt_local;
  
  pPage = (MemPage *)pnChange;
  pnChange_local._0_4_ = freePageFlag;
  pnChange_local._4_4_ = pgno;
  _freePageFlag_local = pBt;
  PVar5 = btreePagecount(pBt);
  if (PVar5 < pgno) {
    iVar6 = sqlite3CorruptError(0x10a60);
    return iVar6;
  }
  pCell._4_4_ = getAndInitPage(_freePageFlag_local,pnChange_local._4_4_,&stack0xffffffffffffffd0,
                               (BtCursor *)0x0,0);
  if (pCell._4_4_ != 0) {
    return pCell._4_4_;
  }
  if (pMStack_30->bBusy == '\0') {
    pMStack_30->bBusy = '\x01';
    info.nPayload = (u32)pMStack_30->hdrOffset;
    info.nLocal = 0;
    info.nSize = 0;
    pCell._4_4_ = 0;
    for (; pBt_00 = _freePageFlag_local, (int)info._20_4_ < (int)(uint)pMStack_30->nCell;
        info._20_4_ = info._20_4_ + 1) {
      puVar4 = pMStack_30->aData;
      uVar3 = pMStack_30->maskPage;
      uVar1 = pMStack_30->aCellIdx[(int)(info._20_4_ << 1)];
      uVar2 = pMStack_30->aCellIdx[(long)(int)(info._20_4_ << 1) + 1];
      if (pMStack_30->leaf == '\0') {
        uVar7 = sqlite3Get4byte(puVar4 + (int)(uint)(uVar3 & CONCAT11(uVar1,uVar2)));
        pCell._4_4_ = clearDatabasePage(pBt_00,uVar7,1,(int *)pPage);
        if (pCell._4_4_ != 0) goto LAB_0016612a;
        pCell._4_4_ = 0;
      }
      pCell._4_4_ = clearCell(pMStack_30,puVar4 + (int)(uint)(uVar3 & CONCAT11(uVar1,uVar2)),
                              (CellInfo *)local_60);
      if (pCell._4_4_ != 0) goto LAB_0016612a;
    }
    if (pMStack_30->leaf == '\0') {
      uVar7 = sqlite3Get4byte(pMStack_30->aData + (int)(info.nPayload + 8));
      pCell._4_4_ = clearDatabasePage(pBt_00,uVar7,1,(int *)pPage);
      if (pCell._4_4_ != 0) goto LAB_0016612a;
    }
    else if (pPage != (MemPage *)0x0) {
      *(uint *)pPage = (uint)pMStack_30->nCell + *(int *)pPage;
    }
    if ((int)pnChange_local == 0) {
      pCell._4_4_ = sqlite3PagerWrite(pMStack_30->pDbPage);
      if (pCell._4_4_ == 0) {
        zeroPage(pMStack_30,pMStack_30->aData[(int)info.nPayload] | 8);
      }
    }
    else {
      freePage(pMStack_30,(int *)((long)&pCell + 4));
    }
  }
  else {
    pCell._4_4_ = sqlite3CorruptError(0x10a65);
  }
LAB_0016612a:
  pMStack_30->bBusy = '\0';
  releasePage(pMStack_30);
  return pCell._4_4_;
}

Assistant:

static int clearDatabasePage(
  BtShared *pBt,           /* The BTree that contains the table */
  Pgno pgno,               /* Page number to clear */
  int freePageFlag,        /* Deallocate page if true */
  int *pnChange            /* Add number of Cells freed to this counter */
){
  MemPage *pPage;
  int rc;
  unsigned char *pCell;
  int i;
  int hdr;
  CellInfo info;

  assert( sqlite3_mutex_held(pBt->mutex) );
  if( pgno>btreePagecount(pBt) ){
    return SQLITE_CORRUPT_BKPT;
  }
  rc = getAndInitPage(pBt, pgno, &pPage, 0, 0);
  if( rc ) return rc;
  if( pPage->bBusy ){
    rc = SQLITE_CORRUPT_BKPT;
    goto cleardatabasepage_out;
  }
  pPage->bBusy = 1;
  hdr = pPage->hdrOffset;
  for(i=0; i<pPage->nCell; i++){
    pCell = findCell(pPage, i);
    if( !pPage->leaf ){
      rc = clearDatabasePage(pBt, get4byte(pCell), 1, pnChange);
      if( rc ) goto cleardatabasepage_out;
    }
    rc = clearCell(pPage, pCell, &info);
    if( rc ) goto cleardatabasepage_out;
  }
  if( !pPage->leaf ){
    rc = clearDatabasePage(pBt, get4byte(&pPage->aData[hdr+8]), 1, pnChange);
    if( rc ) goto cleardatabasepage_out;
  }else if( pnChange ){
    assert( pPage->intKey || CORRUPT_DB );
    testcase( !pPage->intKey );
    *pnChange += pPage->nCell;
  }
  if( freePageFlag ){
    freePage(pPage, &rc);
  }else if( (rc = sqlite3PagerWrite(pPage->pDbPage))==0 ){
    zeroPage(pPage, pPage->aData[hdr] | PTF_LEAF);
  }

cleardatabasepage_out:
  pPage->bBusy = 0;
  releasePage(pPage);
  return rc;
}